

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int source_get_default_outcome(SOURCE_HANDLE source,AMQP_VALUE *default_outcome_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int iVar3;
  uint32_t item_count;
  uint local_1c;
  
  if (source == (SOURCE_HANDLE)0x0) {
    iVar3 = 0x331b;
  }
  else {
    iVar1 = amqpvalue_get_composite_item_count(source->composite_value,&local_1c);
    iVar3 = 0x3323;
    if ((iVar1 == 0) && (iVar3 = 0x3329, 8 < local_1c)) {
      value = amqpvalue_get_composite_item_in_place(source->composite_value,8);
      iVar3 = 0x3331;
      if (value != (AMQP_VALUE)0x0) {
        AVar2 = amqpvalue_get_type(value);
        if (AVar2 != AMQP_TYPE_NULL) {
          *default_outcome_value = value;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int source_get_default_outcome(SOURCE_HANDLE source, AMQP_VALUE* default_outcome_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        if (amqpvalue_get_composite_item_count(source_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 8)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(source_instance->composite_value, 8);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    *default_outcome_value = item_value;
                    result = 0;
                }
            }
        }
    }

    return result;
}